

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void __thiscall tinygltf::Material::~Material(Material *this)

{
  Material *this_local;
  
  std::__cxx11::string::~string((string *)&this->extensions_json_string);
  std::__cxx11::string::~string((string *)&this->extras_json_string);
  Value::~Value(&this->extras);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::~map(&this->extensions);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter>_>_>
  ::~map(&this->additionalValues);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter>_>_>
  ::~map(&this->values);
  TextureInfo::~TextureInfo(&this->emissiveTexture);
  OcclusionTextureInfo::~OcclusionTextureInfo(&this->occlusionTexture);
  NormalTextureInfo::~NormalTextureInfo(&this->normalTexture);
  PbrMetallicRoughness::~PbrMetallicRoughness(&this->pbrMetallicRoughness);
  std::vector<int,_std::allocator<int>_>::~vector(&this->lods);
  std::__cxx11::string::~string((string *)&this->alphaMode);
  std::vector<double,_std::allocator<double>_>::~vector(&this->emissiveFactor);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Material() = default;